

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

void __thiscall
TEST_MockComparatorCopierTest_twoCustomTypeOutputParameters_Test::testBody
          (TEST_MockComparatorCopierTest_twoCustomTypeOutputParameters_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  MockExpectedCall *pMVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  MockActualCall *pMVar4;
  undefined4 extraout_var_02;
  UtestShell *pUVar5;
  char *pcVar6;
  char *pcVar7;
  TestTerminator *pTVar8;
  SimpleString local_268;
  SimpleString local_258;
  SimpleString local_248;
  SimpleString local_238;
  SimpleString local_228;
  SimpleString local_218;
  SimpleString local_208;
  SimpleString local_1f8;
  SimpleString local_1e8;
  SimpleString local_1d8;
  SimpleString local_1c8;
  SimpleString local_1b8;
  SimpleString local_1a8;
  SimpleString local_198;
  SimpleString local_188;
  SimpleString local_178;
  SimpleString local_168;
  SimpleString local_158;
  SimpleString local_148;
  SimpleString local_138;
  SimpleString local_128;
  SimpleString local_118;
  SimpleString local_108;
  SimpleString local_f8;
  SimpleString local_e8;
  SimpleString local_d8;
  SimpleString local_c8;
  SimpleString local_b8;
  SimpleString local_a8;
  SimpleString local_98;
  SimpleString local_88;
  SimpleString local_78;
  MyTypeForTestingCopier local_68;
  MyTypeForTestingCopier copier;
  MyTypeForTesting actualObject2;
  MyTypeForTesting expectedObject2;
  undefined1 local_30 [8];
  MyTypeForTesting actualObject1;
  MyTypeForTesting expectedObject1;
  TEST_MockComparatorCopierTest_twoCustomTypeOutputParameters_Test *this_local;
  
  MyTypeForTesting::MyTypeForTesting((MyTypeForTesting *)&actualObject1.value,0x221);
  MyTypeForTesting::MyTypeForTesting((MyTypeForTesting *)local_30,0x3d3);
  MyTypeForTesting::MyTypeForTesting((MyTypeForTesting *)&actualObject2.value,0x7b);
  MyTypeForTesting::MyTypeForTesting((MyTypeForTesting *)&copier,0x11d7);
  MyTypeForTestingCopier::MyTypeForTestingCopier(&local_68);
  SimpleString::SimpleString(&local_78,"");
  pMVar2 = mock(&local_78,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_88,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2d])(pMVar2,&local_88,&local_68);
  SimpleString::~SimpleString(&local_88);
  SimpleString::~SimpleString(&local_78);
  SimpleString::SimpleString(&local_98,"");
  pMVar2 = mock(&local_98,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a8,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_a8);
  SimpleString::SimpleString(&local_b8,"MyTypeForTesting");
  SimpleString::SimpleString(&local_c8,"parameterName");
  pMVar3 = (MockExpectedCall *)
           (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))
                     ((long *)CONCAT44(extraout_var,iVar1),&local_b8,&local_c8,&actualObject1.value)
  ;
  SimpleString::SimpleString(&local_d8,"id");
  MockExpectedCall::withParameter(pMVar3,&local_d8,1);
  SimpleString::~SimpleString(&local_d8);
  SimpleString::~SimpleString(&local_c8);
  SimpleString::~SimpleString(&local_b8);
  SimpleString::~SimpleString(&local_a8);
  SimpleString::~SimpleString(&local_98);
  SimpleString::SimpleString(&local_e8,"");
  pMVar2 = mock(&local_e8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_f8,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_f8);
  SimpleString::SimpleString(&local_108,"MyTypeForTesting");
  SimpleString::SimpleString(&local_118,"parameterName");
  pMVar3 = (MockExpectedCall *)
           (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x38))
                     ((long *)CONCAT44(extraout_var_00,iVar1),&local_108,&local_118,
                      &actualObject2.value);
  SimpleString::SimpleString(&local_128,"id");
  MockExpectedCall::withParameter(pMVar3,&local_128,2);
  SimpleString::~SimpleString(&local_128);
  SimpleString::~SimpleString(&local_118);
  SimpleString::~SimpleString(&local_108);
  SimpleString::~SimpleString(&local_f8);
  SimpleString::~SimpleString(&local_e8);
  SimpleString::SimpleString(&local_138,"");
  pMVar2 = mock(&local_138,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_148,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_148);
  SimpleString::SimpleString(&local_158,"MyTypeForTesting");
  SimpleString::SimpleString(&local_168,"parameterName");
  pMVar4 = (MockActualCall *)
           (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x30))
                     ((long *)CONCAT44(extraout_var_01,iVar1),&local_158,&local_168,local_30);
  SimpleString::SimpleString(&local_178,"id");
  MockActualCall::withParameter(pMVar4,&local_178,1);
  SimpleString::~SimpleString(&local_178);
  SimpleString::~SimpleString(&local_168);
  SimpleString::~SimpleString(&local_158);
  SimpleString::~SimpleString(&local_148);
  SimpleString::~SimpleString(&local_138);
  SimpleString::SimpleString(&local_188,"");
  pMVar2 = mock(&local_188,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_198,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_198);
  SimpleString::SimpleString(&local_1a8,"MyTypeForTesting");
  SimpleString::SimpleString(&local_1b8,"parameterName");
  pMVar4 = (MockActualCall *)
           (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar1) + 0x30))
                     ((long *)CONCAT44(extraout_var_02,iVar1),&local_1a8,&local_1b8,&copier);
  SimpleString::SimpleString(&local_1c8,"id");
  MockActualCall::withParameter(pMVar4,&local_1c8,2);
  SimpleString::~SimpleString(&local_1c8);
  SimpleString::~SimpleString(&local_1b8);
  SimpleString::~SimpleString(&local_1a8);
  SimpleString::~SimpleString(&local_198);
  SimpleString::~SimpleString(&local_188);
  SimpleString::SimpleString(&local_1d8,"");
  pMVar2 = mock(&local_1d8,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_1d8);
  if (*expectedObject1._vptr_MyTypeForTesting == (_func_int *)0x221) {
    pUVar5 = UtestShell::getCurrent();
    pTVar8 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,300,pTVar8);
  }
  else {
    if (*expectedObject1._vptr_MyTypeForTesting != *expectedObject1._vptr_MyTypeForTesting) {
      pUVar5 = UtestShell::getCurrent();
      (*pUVar5->_vptr_UtestShell[0x1c])
                (pUVar5,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                 ,300);
    }
    pUVar5 = UtestShell::getCurrent();
    ::StringFrom((int)&local_1e8);
    pcVar6 = SimpleString::asCharString(&local_1e8);
    ::StringFrom((long)&local_1f8);
    pcVar7 = SimpleString::asCharString(&local_1f8);
    pTVar8 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,300,pTVar8);
    SimpleString::~SimpleString(&local_1f8);
    SimpleString::~SimpleString(&local_1e8);
  }
  if (*actualObject1._vptr_MyTypeForTesting == (_func_int *)0x221) {
    pUVar5 = UtestShell::getCurrent();
    pTVar8 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x12d,pTVar8);
  }
  else {
    if (*actualObject1._vptr_MyTypeForTesting != *actualObject1._vptr_MyTypeForTesting) {
      pUVar5 = UtestShell::getCurrent();
      (*pUVar5->_vptr_UtestShell[0x1c])
                (pUVar5,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                 ,0x12d);
    }
    pUVar5 = UtestShell::getCurrent();
    ::StringFrom((int)&local_208);
    pcVar6 = SimpleString::asCharString(&local_208);
    ::StringFrom((long)&local_218);
    pcVar7 = SimpleString::asCharString(&local_218);
    pTVar8 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x12d,pTVar8);
    SimpleString::~SimpleString(&local_218);
    SimpleString::~SimpleString(&local_208);
  }
  if (*expectedObject2._vptr_MyTypeForTesting == (_func_int *)0x7b) {
    pUVar5 = UtestShell::getCurrent();
    pTVar8 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x12e,pTVar8);
  }
  else {
    if (*expectedObject2._vptr_MyTypeForTesting != *expectedObject2._vptr_MyTypeForTesting) {
      pUVar5 = UtestShell::getCurrent();
      (*pUVar5->_vptr_UtestShell[0x1c])
                (pUVar5,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                 ,0x12e);
    }
    pUVar5 = UtestShell::getCurrent();
    ::StringFrom((int)&local_228);
    pcVar6 = SimpleString::asCharString(&local_228);
    ::StringFrom((long)&local_238);
    pcVar7 = SimpleString::asCharString(&local_238);
    pTVar8 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x12e,pTVar8);
    SimpleString::~SimpleString(&local_238);
    SimpleString::~SimpleString(&local_228);
  }
  if (*actualObject2._vptr_MyTypeForTesting == (_func_int *)0x7b) {
    pUVar5 = UtestShell::getCurrent();
    pTVar8 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x12f,pTVar8);
  }
  else {
    if (*actualObject2._vptr_MyTypeForTesting != *actualObject2._vptr_MyTypeForTesting) {
      pUVar5 = UtestShell::getCurrent();
      (*pUVar5->_vptr_UtestShell[0x1c])
                (pUVar5,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                 ,0x12f);
    }
    pUVar5 = UtestShell::getCurrent();
    ::StringFrom((int)&local_248);
    pcVar6 = SimpleString::asCharString(&local_248);
    ::StringFrom((long)&local_258);
    pcVar7 = SimpleString::asCharString(&local_258);
    pTVar8 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
               ,0x12f,pTVar8);
    SimpleString::~SimpleString(&local_258);
    SimpleString::~SimpleString(&local_248);
  }
  SimpleString::SimpleString(&local_268,"");
  pMVar2 = mock(&local_268,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x2f])();
  SimpleString::~SimpleString(&local_268);
  MyTypeForTestingCopier::~MyTypeForTestingCopier(&local_68);
  MyTypeForTesting::~MyTypeForTesting((MyTypeForTesting *)&copier);
  MyTypeForTesting::~MyTypeForTesting((MyTypeForTesting *)&actualObject2.value);
  MyTypeForTesting::~MyTypeForTesting((MyTypeForTesting *)local_30);
  MyTypeForTesting::~MyTypeForTesting((MyTypeForTesting *)&actualObject1.value);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, twoCustomTypeOutputParameters)
{
    MyTypeForTesting expectedObject1(545);
    MyTypeForTesting actualObject1(979);
    MyTypeForTesting expectedObject2(123);
    MyTypeForTesting actualObject2(4567);
    MyTypeForTestingCopier copier;
    mock().installCopier("MyTypeForTesting", copier);

    mock().expectOneCall("function").withOutputParameterOfTypeReturning("MyTypeForTesting", "parameterName", &expectedObject1).withParameter("id", 1);
    mock().expectOneCall("function").withOutputParameterOfTypeReturning("MyTypeForTesting", "parameterName", &expectedObject2).withParameter("id", 2);
    mock().actualCall("function").withOutputParameterOfType("MyTypeForTesting", "parameterName", &actualObject1).withParameter("id", 1);
    mock().actualCall("function").withOutputParameterOfType("MyTypeForTesting", "parameterName", &actualObject2).withParameter("id", 2);

    mock().checkExpectations();
    CHECK_EQUAL(545, *(expectedObject1.value));
    CHECK_EQUAL(545, *(actualObject1.value));
    CHECK_EQUAL(123, *(expectedObject2.value));
    CHECK_EQUAL(123, *(actualObject2.value));

    mock().removeAllComparatorsAndCopiers();
}